

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

size_t crnd::crnd_msize(void *p)

{
  void *p_local;
  
  if (p == (void *)0x0) {
    p_local = (void *)0x0;
  }
  else if (((ulong)p & 7) == 0) {
    p_local = (void *)(*(code *)g_pMSize)(p,g_pUser_data);
  }
  else {
    crnd_mem_error("crnd_msize: bad ptr");
    p_local = (void *)0x0;
  }
  return (size_t)p_local;
}

Assistant:

size_t crnd_msize(void* p) {
  if (!p)
    return 0;

  if ((uint32) reinterpret_cast<uintptr_t>(p) & (CRND_MIN_ALLOC_ALIGNMENT - 1)) {
    crnd_mem_error("crnd_msize: bad ptr");
    return 0;
  }

  return (*g_pMSize)(p, g_pUser_data);
}